

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

void __thiscall
ConfidentialTxIn_SetPeginWitnessStack_Test::TestBody
          (ConfidentialTxIn_SetPeginWitnessStack_Test *this)

{
  bool bVar1;
  const_reference this_00;
  char *pcVar2;
  char *rhs;
  AssertHelper local_378;
  Message local_370 [2];
  CfdException *anon_var_0;
  byte local_339;
  char *pcStack_338;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_328;
  ByteData256 local_320;
  string local_308;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_1;
  Message local_2d0;
  string local_2c8;
  string local_2a8;
  undefined1 local_288 [8];
  AssertionResult gtest_ar;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_258;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_240;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *test_peg_vector;
  Message local_230 [2];
  ScriptWitness local_220;
  undefined1 local_200 [8];
  ConfidentialTxIn txin;
  uint32_t target_index;
  undefined1 local_78 [8];
  ByteData exp_data;
  undefined1 local_50 [8];
  ScriptWitness exp_pegin_witness;
  ScriptWitness exp_witness_stack;
  ConfidentialTxIn_SetPeginWitnessStack_Test *this_local;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&target_index,"1234567890",
             (allocator *)
             ((long)&txin.pegin_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_78,(string *)&target_index);
  std::__cxx11::string::~string((string *)&target_index);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&txin.pegin_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  txin.pegin_witness_.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_200,&exp_txid,2,0xfffffffe,&exp_script,
             (ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&exp_blinding_nonce,&exp_asset_entropy,
             &exp_issuance_amount,&exp_inflation_keys,&exp_issuance_amount_rangeproof,
             &exp_inflation_keys_rangeproof,(ScriptWitness *)local_50);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTxIn::SetPeginWitnessStack
                (&local_220,(ConfidentialTxIn *)local_200,
                 (uint32_t)
                 txin.pegin_witness_.witness_stack_.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)local_78);
      cfd::core::ScriptWitness::~ScriptWitness(&local_220);
    }
  }
  else {
    testing::Message::Message(local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_peg_vector,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,200,
               "Expected: (txin.SetPeginWitnessStack(target_index, exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&test_peg_vector,local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_peg_vector);
    testing::Message::~Message(local_230);
  }
  cfd::core::ConfidentialTxIn::GetPeginWitness
            ((ScriptWitness *)&gtest_ar.message_,(ConfidentialTxIn *)local_200);
  cfd::core::ScriptWitness::GetWitness(&local_258,(ScriptWitness *)&gtest_ar.message_);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&gtest_ar.message_);
  local_240 = &local_258;
  this_00 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                      (local_240,
                       (ulong)(uint32_t)
                              txin.pegin_witness_.witness_stack_.
                              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2a8,this_00);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2c8,(ByteData *)local_78);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_288,"test_peg_vector[target_index].GetHex().c_str()",
             "exp_data.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xcc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  cfd::core::ConfidentialTxIn::GetWitnessHash(&local_320,(ConfidentialTxIn *)local_200);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_308,&local_320);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2e8,"txin.GetWitnessHash().GetHex().c_str()",
             "\"78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd\"",pcVar2,
             "78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd");
  std::__cxx11::string::~string((string *)&local_308);
  cfd::core::ByteData256::~ByteData256(&local_320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffcc8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffcc8);
  if (bVar1) {
    local_339 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTxIn::SetPeginWitnessStack
                ((ScriptWitness *)&anon_var_0,(ConfidentialTxIn *)local_200,9,(ByteData *)local_78);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&anon_var_0);
    }
    if ((local_339 & 1) != 0) goto LAB_0048d3ba;
    pcStack_338 = 
    "Expected: (txin.SetPeginWitnessStack(9, exp_data)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_370);
  testing::internal::AssertHelper::AssertHelper
            (&local_378,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
             ,0xd2,pcStack_338);
  testing::internal::AssertHelper::operator=(&local_378,local_370);
  testing::internal::AssertHelper::~AssertHelper(&local_378);
  testing::Message::~Message(local_370);
LAB_0048d3ba:
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_258);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_200);
  cfd::core::ByteData::~ByteData((ByteData *)local_78);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)local_50);
  cfd::core::ScriptWitness::~ScriptWitness
            ((ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ConfidentialTxIn, SetPeginWitnessStack) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  uint32_t target_index = 1;

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_NO_THROW((txin.SetPeginWitnessStack(target_index, exp_data)));
  const std::vector<ByteData>& test_peg_vector = txin.GetPeginWitness()
      .GetWitness();
  EXPECT_STREQ(test_peg_vector[target_index].GetHex().c_str(),
      exp_data.GetHex().c_str());

  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd");

  // fail case
  EXPECT_THROW((txin.SetPeginWitnessStack(9, exp_data)), CfdException);
}